

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::CallOrCast::CallOrCast
          (CallOrCast *this,Expression *nameOrTargetType,
          pool_ptr<soul::AST::CommaSeparatedList> *args,bool isMethod)

{
  CommaSeparatedList *pCVar1;
  SourceCodeText *pSVar2;
  
  pCVar1 = args->object;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ASTObject_00301658;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.objectType =
       CallOrCast;
  pSVar2 = (nameOrTargetType->super_Statement).super_ASTObject.context.location.sourceCode.object;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.location.
  sourceCode.object = pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.location.
  location.data = (nameOrTargetType->super_Statement).super_ASTObject.context.location.location.data
  ;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.parentScope
       = (nameOrTargetType->super_Statement).super_ASTObject.context.parentScope;
  (this->super_CallOrCastBase).super_Expression.kind = value;
  (this->super_CallOrCastBase).arguments.object = pCVar1;
  (this->super_CallOrCastBase).isMethodCall = isMethod;
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__CallOrCast_003025f0;
  (this->nameOrType).object = nameOrTargetType;
  return;
}

Assistant:

CallOrCast (Expression& nameOrTargetType, pool_ptr<CommaSeparatedList> args, bool isMethod)
            : CallOrCastBase (ObjectType::CallOrCast, nameOrTargetType.context, args, isMethod), nameOrType (nameOrTargetType)
        {
        }